

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFAContentModel.hpp
# Opt level: O3

uint __thiscall
xercesc_4_0::DFAContentModel::getNextState
          (DFAContentModel *this,uint currentState,XMLSize_t elementIndex)

{
  ArrayIndexOutOfBoundsException *this_00;
  
  if (currentState != 0xffffffff) {
    if ((this->fTransTableSize <= currentState) || (this->fElemMapSize <= elementIndex)) {
      this_00 = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
      ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/DFAContentModel.hpp"
                 ,0x102,Array_BadIndex,this->fMemoryManager);
      __cxa_throw(this_00,&ArrayIndexOutOfBoundsException::typeinfo,XMLException::~XMLException);
    }
    currentState = this->fTransTable[currentState][elementIndex];
  }
  return currentState;
}

Assistant:

inline unsigned int
DFAContentModel::getNextState(unsigned int currentState,
                              XMLSize_t    elementIndex) const {

    if (currentState == XMLContentModel::gInvalidTrans) {
        return XMLContentModel::gInvalidTrans;
    }

    if (currentState >= fTransTableSize || elementIndex >= fElemMapSize) {
        ThrowXMLwithMemMgr(ArrayIndexOutOfBoundsException, XMLExcepts::Array_BadIndex, fMemoryManager);
    }

    return fTransTable[currentState][elementIndex];
}